

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O2

void __thiscall OpenMD::KirkwoodBuff::processHistograms(KirkwoodBuff *this)

{
  long lVar1;
  long lVar2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  RealType RVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<int,_std::allocator<int>_> nPairs;
  
  std::vector<int,_std::allocator<int>_>::vector(&nPairs,&(this->super_MultiComponentRDF).nPairs_);
  RVar6 = Snapshot::getVolume(((this->super_MultiComponentRDF).super_StaticAnalyser.info_)->sman_->
                              currentSnapshot_);
  this->meanVol_ = this->meanVol_ + RVar6;
  pvVar3 = (this->histograms_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(this->histograms_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar5 = uVar5 + 1) {
    lVar2 = *(long *)&pvVar3[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&pvVar3[uVar5].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar2 >> 2);
        uVar4 = uVar4 + 1) {
      auVar8._8_4_ = (int)(uVar4 >> 0x20);
      auVar8._0_8_ = uVar4;
      auVar8._12_4_ = 0x45300000;
      dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * this->deltaR_;
      dVar7 = pow(this->deltaR_ + dVar9,3.0);
      dVar9 = pow(dVar9,3.0);
      auVar10._0_8_ = (dVar7 - dVar9) * 12.566370614359172;
      auVar10._8_8_ =
           (double)nPairs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
      auVar11._8_8_ = RVar6;
      auVar11._0_8_ = 0x4008000000000000;
      auVar11 = divpd(auVar10,auVar11);
      pvVar3 = (this->histograms_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar3[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      lVar1 = *(long *)&(this->gofrs_).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar1 + uVar4 * 8) =
           (double)*(int *)(lVar2 + uVar4 * 4) / (auVar11._8_8_ * auVar11._0_8_) +
           *(double *)(lVar1 + uVar4 * 8);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nPairs.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void KirkwoodBuff::processHistograms() {
    std::vector<int> nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();

    meanVol_ += volume;

    for (std::size_t i {}; i < histograms_.size(); ++i) {
      for (std::size_t j {}; j < histograms_[i].size(); ++j) {
        RealType rLower   = j * deltaR_;
        RealType rUpper   = rLower + deltaR_;
        RealType volSlice = 4.0 * Constants::PI *
                            (std::pow(rUpper, 3) - std::pow(rLower, 3)) / 3.0;
        RealType pairDensity = nPairs[i] / volume;
        RealType nIdeal      = volSlice * pairDensity;

        gofrs_[i][j] += histograms_[i][j] / nIdeal;
      }
    }
  }